

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.c
# Opt level: O1

int chirc_ctx_load_network(chirc_ctx_t *ctx,char *file,char *servername)

{
  int iVar1;
  FILE *__stream;
  __ssize_t _Var2;
  sds s;
  sds *ppcVar3;
  chirc_server_t *pcVar4;
  chirc_server_t *server;
  char *pcVar5;
  ulong len_00;
  char *l;
  int count;
  size_t len;
  char *local_50;
  int local_44;
  sds local_40;
  size_t local_38;
  
  local_50 = (char *)0x0;
  local_38 = 0;
  local_40 = servername;
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    pcVar5 = "Could not read file %s\n";
LAB_0010651e:
    serverlog(CRITICAL,(chirc_connection_t *)0x0,pcVar5,file);
  }
  else {
    do {
      _Var2 = getline(&local_50,&local_38,__stream);
      if (_Var2 == -1) {
        fclose(__stream);
        free(local_50);
        if ((ctx->network).this_server != (chirc_server_t *)0x0) {
          return 0;
        }
        pcVar5 = "Network file does not include an entry for %s";
        file = local_40;
        goto LAB_0010651e;
      }
      s = sdsnew(local_50);
      file = sdstrim(s," \r\n");
      switch(file[-1] & 7) {
      case 0:
        len_00 = (ulong)((byte)file[-1] >> 3);
        break;
      case 1:
        len_00 = (ulong)(byte)file[-3];
        break;
      case 2:
        len_00 = (ulong)*(ushort *)(file + -5);
        break;
      case 3:
        len_00 = (ulong)*(uint *)(file + -9);
        break;
      case 4:
        len_00 = *(ulong *)(file + -0x11);
        break;
      default:
        len_00 = 0;
      }
      ppcVar3 = sdssplitlen(file,len_00,",",1,&local_44);
      if (local_44 != 4) {
        pcVar5 = "Invalid line in network file: %s";
        goto LAB_0010651e;
      }
      pcVar5 = *ppcVar3;
      pcVar4 = chirc_ctx_get_server(ctx,pcVar5);
      if (pcVar4 == (chirc_server_t *)0x0) {
        server = (chirc_server_t *)calloc(1,0x68);
        server->servername = pcVar5;
        server->hostname = ppcVar3[1];
        server->port = ppcVar3[2];
        server->passwd = ppcVar3[3];
        server->conn = (chirc_connection_t *)0x0;
        chirc_ctx_add_server(ctx,server);
        iVar1 = strcmp(server->servername,local_40);
        if (iVar1 == 0) {
          (ctx->network).this_server = server;
        }
      }
      else {
        serverlog(CRITICAL,(chirc_connection_t *)0x0,
                  "Network file contains duplicate server name: %s",pcVar4->servername);
      }
    } while (pcVar4 == (chirc_server_t *)0x0);
  }
  return -1;
}

Assistant:

int chirc_ctx_load_network(chirc_ctx_t *ctx, char *file, char *servername)
{
    FILE *fp;
    char *l = NULL;
    size_t len = 0;
    ssize_t read;

    fp = fopen(file, "r");
    if (fp == NULL)
    {
        serverlog(CRITICAL, NULL, "Could not read file %s\n", file);
        return CHIRC_FAIL;
    }

    while ((read = getline(&l, &len, fp)) != -1)
    {
        sds line = sdsnew(l);
        line = sdstrim(line, " \r\n");
        sds *tokens;
        int count;

        tokens = sdssplitlen(line, sdslen(line),",",1, &count);

        if (count != 4)
        {
            serverlog(CRITICAL, NULL, "Invalid line in network file: %s", line);
            return CHIRC_FAIL;
        }

        chirc_server_t *ns;

        ns = chirc_ctx_get_server(ctx, tokens[0]);

        if (ns)
        {
            serverlog(CRITICAL, NULL, "Network file contains duplicate server name: %s", ns->servername);
            return CHIRC_FAIL;
        }

        ns = calloc(1, sizeof(chirc_server_t));

        ns->servername = tokens[0];
        ns->hostname = tokens[1];
        ns->port = tokens[2];
        ns->passwd = tokens[3];
        ns->conn = NULL;

        chirc_ctx_add_server(ctx, ns);

        if (strcmp(ns->servername, servername) == 0)
        {
            ctx->network.this_server = ns;
        }
    }

    fclose(fp);
    free(l);

    if (ctx->network.this_server == NULL)
    {
        serverlog(CRITICAL, NULL, "Network file does not include an entry for %s", servername);
        return CHIRC_FAIL;
    }

    return CHIRC_OK;
}